

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  vertex_t t;
  uint *puVar1;
  long *plVar2;
  void *pvVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  undefined8 uVar6;
  degree_t dVar7;
  long lVar8;
  KReach *this;
  DynamicKReach *this_00;
  ScalableKReach *this_01;
  DynamicScalableKReach *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  ostream *poVar10;
  vertex_t vVar11;
  pair<unsigned_int,_unsigned_int> *p;
  pair<unsigned_int,_unsigned_int> *ppVar12;
  uint *puVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  unique_ptr<AbstractKReach,_std::default_delete<AbstractKReach>_> indexes [4];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  edges;
  vector<unsigned_int,_std::allocator<unsigned_int>_> out;
  Graph graph;
  vector<unsigned_int,_std::allocator<unsigned_int>_> in;
  string local_f8;
  pair<unsigned_int,_unsigned_int> *local_d8;
  iterator iStack_d0;
  pair<unsigned_int,_unsigned_int> *local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  pair<unsigned_int,_unsigned_int> *local_a0;
  Graph local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  Graph::Graph(&local_98);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"data/sample.kreach","");
  Graph::from_kreach(&local_98,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  Graph::compute_degree(&local_98);
  lVar8 = 0;
  do {
    *(undefined8 *)((long)&local_f8._M_dataplus._M_p + lVar8) = 0;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x20);
  this = (KReach *)operator_new(0xb0);
  KReach::KReach(this,&local_98,'\x03');
  _Var4._M_p = local_f8._M_dataplus._M_p;
  bVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_f8._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
  local_f8._M_dataplus._M_p = (pointer)this;
  if (bVar16) {
    operator_delete(_Var4._M_p,8);
  }
  this_00 = (DynamicKReach *)operator_new(0x120);
  DynamicKReach::DynamicKReach(this_00,&local_98,'\x03');
  sVar5 = local_f8._M_string_length;
  bVar16 = (void *)local_f8._M_string_length != (void *)0x0;
  local_f8._M_string_length = (size_type)this_00;
  if (bVar16) {
    operator_delete((void *)sVar5,8);
  }
  this_01 = (ScalableKReach *)operator_new(0x200);
  ScalableKReach::ScalableKReach(this_01,&local_98,'\x03',1000,10000);
  uVar6 = local_f8.field_2._M_allocated_capacity;
  bVar16 = (void *)local_f8.field_2._M_allocated_capacity != (void *)0x0;
  local_f8.field_2._M_allocated_capacity = (size_type)this_01;
  if (bVar16) {
    operator_delete((void *)uVar6,8);
  }
  this_02 = (DynamicScalableKReach *)operator_new(0x338);
  DynamicScalableKReach::DynamicScalableKReach(this_02,&local_98,'\x03',1000,10000);
  uVar6 = local_f8.field_2._8_8_;
  local_f8.field_2._8_8_ = this_02;
  if ((void *)uVar6 != (void *)0x0) {
    operator_delete((void *)uVar6,8);
  }
  lVar8 = 0;
  do {
    (**(code **)**(undefined8 **)((long)&local_f8._M_dataplus._M_p + lVar8))();
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x20);
  local_d8 = (pair<unsigned_int,_unsigned_int> *)0x0;
  iStack_d0._M_current = (pair<unsigned_int,_unsigned_int> *)0x0;
  local_c8 = (pair<unsigned_int,_unsigned_int> *)0x0;
  uVar14 = 0;
  while( true ) {
    dVar7 = Graph::num_vertices(&local_98);
    if (dVar7 <= uVar14) break;
    pvVar9 = Graph::successors(&local_98,(vertex_t)uVar14);
    puVar1 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar13 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start; puVar13 != puVar1; puVar13 = puVar13 + 1) {
      local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)*puVar13 << 0x20 | uVar14);
      if (iStack_d0._M_current == local_c8) {
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)&local_d8,iStack_d0,(pair<unsigned_int,_unsigned_int> *)&local_b8);
      }
      else {
        *iStack_d0._M_current =
             (pair<unsigned_int,_unsigned_int>)
             local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
        iStack_d0._M_current = iStack_d0._M_current + 1;
      }
    }
    uVar14 = uVar14 + 1;
  }
  local_a0 = iStack_d0._M_current;
  if (local_d8 != iStack_d0._M_current) {
    ppVar12 = local_d8;
    do {
      vVar11 = ppVar12->first;
      t = ppVar12->second;
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      Graph::remove_edge(&local_98,vVar11,t);
      lVar8 = 0;
      do {
        plVar2 = *(long **)((long)&local_f8._M_dataplus._M_p + lVar8);
        (**(code **)(*plVar2 + 0x18))(plVar2,vVar11,t);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      lVar8 = 0;
      do {
        lVar15 = 0;
        do {
          equals(&local_98,*(AbstractKReach **)((long)&local_f8._M_dataplus._M_p + lVar8),
                 *(AbstractKReach **)((long)&local_f8._M_dataplus._M_p + lVar15));
          lVar15 = lVar15 + 8;
        } while (lVar15 != 0x20);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      Graph::insert_edge(&local_98,vVar11,t);
      lVar8 = 0;
      do {
        plVar2 = *(long **)((long)&local_f8._M_dataplus._M_p + lVar8);
        (**(code **)(*plVar2 + 0x10))(plVar2,vVar11,t);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      lVar8 = 0;
      do {
        lVar15 = 0;
        do {
          equals(&local_98,*(AbstractKReach **)((long)&local_f8._M_dataplus._M_p + lVar8),
                 *(AbstractKReach **)((long)&local_f8._M_dataplus._M_p + lVar15));
          lVar15 = lVar15 + 8;
        } while (lVar15 != 0x20);
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x20);
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 != local_a0);
  }
  uVar14 = 0;
  while( true ) {
    dVar7 = Graph::num_vertices(&local_98);
    if (dVar7 <= uVar14) break;
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    vVar11 = (vertex_t)uVar14;
    pvVar9 = Graph::successors(&local_98,vVar11);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_b8,pvVar9);
    pvVar9 = Graph::predecessors(&local_98,vVar11);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,pvVar9);
    Graph::remove_vertex(&local_98,vVar11);
    lVar8 = 0;
    do {
      plVar2 = *(long **)((long)&local_f8._M_dataplus._M_p + lVar8);
      (**(code **)(*plVar2 + 0x20))(plVar2,uVar14 & 0xffffffff,&local_b8,&local_48);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    lVar8 = 0;
    do {
      lVar15 = 0;
      do {
        equals(&local_98,*(AbstractKReach **)((long)&local_f8._M_dataplus._M_p + lVar8),
               *(AbstractKReach **)((long)&local_f8._M_dataplus._M_p + lVar15));
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x20);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    Graph::insert_vertex(&local_98,vVar11,&local_b8,&local_48);
    lVar8 = 0;
    do {
      plVar2 = *(long **)((long)&local_f8._M_dataplus._M_p + lVar8);
      (**(code **)(*plVar2 + 0x28))(plVar2,uVar14 & 0xffffffff,&local_b8,&local_48);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    lVar8 = 0;
    do {
      lVar15 = 0;
      do {
        equals(&local_98,*(AbstractKReach **)((long)&local_f8._M_dataplus._M_p + lVar8),
               *(AbstractKReach **)((long)&local_f8._M_dataplus._M_p + lVar15));
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x20);
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pair<unsigned_int,_unsigned_int>)
        local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pair<unsigned_int,_unsigned_int>)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar14 = uVar14 + 1;
  }
  if (local_d8 != (pair<unsigned_int,_unsigned_int> *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  lVar8 = 0x18;
  do {
    pvVar3 = *(void **)((long)&local_f8._M_dataplus._M_p + lVar8);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,8);
    }
    *(undefined8 *)((long)&local_f8._M_dataplus._M_p + lVar8) = 0;
    lVar8 = lVar8 + -8;
  } while (lVar8 != -8);
  if (local_98.deg_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.deg_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.deg_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.deg_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_98.pred_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_98.succ_);
  return 0;
}

Assistant:

int main() {
    Graph graph;
    graph.from_kreach("data/sample.kreach");
    graph.compute_degree();

    unique_ptr<AbstractKReach> indexes[4];
    indexes[0].reset(new KReach(graph, 3));
    indexes[1].reset(new DynamicKReach(graph, 3));
    indexes[2].reset(new ScalableKReach(graph, 3, 1000, 10000));
    indexes[3].reset(new DynamicScalableKReach(graph, 3, 1000, 10000));

    for (auto &i : indexes){
        i->construct();
    }

    vector<pair<vertex_t, vertex_t>> edges;
    for (vertex_t s = 0; s < graph.num_vertices(); ++s) {
        for (vertex_t t : graph.successors(s)) {
            edges.push_back(make_pair(s, t));
        }
    }

    /*
     * Edge operations
     */
    for (const auto &p : edges) {
        auto s = p.first;
        auto t = p.second;
        cout << s << " " << t << endl;

        graph.remove_edge(s, t);

        for (auto &i : indexes){
            i->remove_edge(s, t);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

        graph.insert_edge(s, t);

        for (auto &i : indexes){
            i->insert_edge(s, t);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

    }

    /*
     * Vertex operations
     */
    for (vertex_t s = 0; s < graph.num_vertices(); ++s){
        cout << s << endl;
        auto out = move(graph.successors(s)), in = move(graph.predecessors(s));

        graph.remove_vertex(s);

        for (auto &i : indexes){
            i->remove_vertex(s, out, in);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }

        graph.insert_vertex(s, out, in);

        for (auto &i : indexes){
            i->insert_vertex(s, out, in);
        }
        for (const auto &i : indexes){
            for (const auto &j : indexes){
                equals(graph, *i, *j);
            }
        }
    }

    return 0;
}